

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmListFileBacktrace *file;
  pointer *this_00;
  cmake *this_01;
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  iterator iVar5;
  cmListFileFunction *func;
  pointer pcVar6;
  pointer ppcVar7;
  cmListFileFunction *func_1;
  pointer __lhs;
  int local_184;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  pointer local_100;
  pointer pcStack_f8;
  pointer local_f0;
  cmListFile listFile;
  string currentStart;
  string filesDir;
  BuildsystemFileScope scope;
  
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&subdirs,&this->StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&subdirs);
  std::__cxx11::string::string((string *)&currentStart,(string *)psVar4);
  std::__cxx11::string::append((char *)&currentStart);
  file = &this->Backtrace;
  cmListFileBacktrace::Push((cmListFileBacktrace *)&subdirs,(string *)file);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)file,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)&subdirs)
  ;
  this_00 = &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  BuildsystemFileScope::BuildsystemFileScope(&scope,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&subdirs,&this->StateSnapshot);
  psVar4 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&subdirs);
  std::__cxx11::string::string((string *)&filesDir,(string *)psVar4);
  std::__cxx11::string::append((char *)&filesDir);
  cmsys::SystemTools::MakeDirectory(&filesDir,(mode_t *)0x0);
  bVar3 = cmsys::SystemTools::FileExists(&currentStart,true);
  if (!bVar3) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                  ,0x606,"void cmMakefile::Configure()");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subdirs,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&listFile);
  AddDefinition(this,(string *)&subdirs,currentStart._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&subdirs);
  listFile.Filename._M_dataplus._M_p = (pointer)&listFile.Filename.field_2;
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  listFile.Filename._M_string_length = 0;
  listFile.Filename.field_2._M_local_buf[0] = '\0';
  bVar3 = cmListFile::ParseFile
                    (&listFile,currentStart._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,file);
  if (!bVar3) goto LAB_00288db6;
  bVar3 = IsRootMakefile(this);
  pcVar2 = listFile.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar6 = listFile.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (bVar3) {
    do {
      if (pcVar6 == pcVar2) {
        if (0x1d < (ulong)(((long)listFile.Functions.
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)listFile.Functions.
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x78))
        goto LAB_00288bbf;
        subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((ulong)subdirs.
                              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
        subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"project",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"set",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"if",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"endif",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"else",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"elseif",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"add_executable",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"add_library",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"target_link_libraries",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"option",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"message",(allocator<char> *)&local_184);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&subdirs,&local_180);
        std::__cxx11::string::~string((string *)&local_180);
        pcVar2 = listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        pcVar6 = listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        goto LAB_00288b9c;
      }
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pcVar6,"cmake_minimum_required");
      pcVar6 = pcVar6 + 1;
      __lhs = listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_start;
      pcVar1 = listFile.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (!bVar3);
    goto LAB_00288c36;
  }
  goto LAB_00288d3c;
  while( true ) {
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&subdirs,(key_type *)pcVar6);
    pcVar6 = pcVar6 + 1;
    if (iVar5._M_node == (_Base_ptr)this_00) break;
LAB_00288b9c:
    if (pcVar6 == pcVar2) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&subdirs);
      __lhs = listFile.Functions.
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_start;
      pcVar1 = listFile.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
      goto LAB_00288c36;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&subdirs);
LAB_00288bbf:
  this->CheckCMP0000 = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subdirs,"2.4",(allocator<char> *)&local_184);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  cmPolicies::ApplyPolicyVersion(this,(string *)&subdirs,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&subdirs);
  __lhs = listFile.Functions.
          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
          super__Vector_impl_data._M_start;
  pcVar1 = listFile.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
LAB_00288c36:
  do {
    if (__lhs == pcVar1) {
      this_01 = this->GlobalGenerator->CMakeInstance;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&subdirs,
                 "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
                 ,(allocator<char> *)&local_180);
      cmake::IssueMessage(this_01,AUTHOR_WARNING,(string *)&subdirs,file);
      std::__cxx11::string::~string((string *)&subdirs);
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage;
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
      local_100 = (pointer)0x0;
      pcStack_f8 = (pointer)0x0;
      local_f0 = (pointer)0x0;
      std::__cxx11::string::assign((char *)&subdirs);
      local_180._M_dataplus._M_p = local_180._M_dataplus._M_p & 0xffffffff00000000;
      local_184 = 0;
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<char_const(&)[8],cmListFileArgument::Delimiter,int>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_100,
                 (char (*) [8])0x4311af,(Delimiter *)&local_180,&local_184);
      local_180._M_dataplus._M_p = local_180._M_dataplus._M_p & 0xffffffff00000000;
      local_184 = 0;
      std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>::
      emplace_back<char_const(&)[35],cmListFileArgument::Delimiter,int>
                ((vector<cmListFileArgument,std::allocator<cmListFileArgument>> *)&local_100,
                 (char (*) [35])"__CMAKE_INJECTED_PROJECT_COMMAND__",(Delimiter *)&local_180,
                 &local_184);
      std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                (&listFile.Functions,
                 (const_iterator)
                 listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start,(value_type *)&subdirs);
      cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&subdirs);
      break;
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __lhs,"project");
    __lhs = __lhs + 1;
  } while (!bVar3);
LAB_00288d3c:
  ReadListFile(this,&listFile,&currentStart);
  bVar3 = cmSystemTools::GetFatalErrorOccured();
  if (bVar3) {
    scope.ReportError = false;
  }
  std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
            (&subdirs,&this->UnConfiguredDirectories);
  for (ppcVar7 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar7 !=
      subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
    cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar7)->StateSnapshot);
    ConfigureSubDirectory(this,*ppcVar7);
  }
  AddCMakeDependFilesFromUser(this);
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
LAB_00288db6:
  cmListFile::~cmListFile(&listFile);
  std::__cxx11::string::~string((string *)&filesDir);
  BuildsystemFileScope::~BuildsystemFileScope(&scope);
  std::__cxx11::string::~string((string *)&currentStart);
  return;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart =
    this->StateSnapshot.GetDirectory().GetCurrentSource();
  currentStart += "/CMakeLists.txt";

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace = this->Backtrace.Push(currentStart);

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  filesDir += "/CMakeFiles";
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart.c_str());

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
    return;
  }
  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "cmake_minimum_required") {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (allowedCommands.find(func.Name.Lower) == allowedCommands.end()) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        this->SetPolicyVersion("2.4", std::string());
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.Name.Lower == "project") {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project;
      project.Name.Lower = "project";
      project.Arguments.emplace_back("Project", cmListFileArgument::Unquoted,
                                     0);
      project.Arguments.emplace_back("__CMAKE_INJECTED_PROJECT_COMMAND__",
                                     cmListFileArgument::Unquoted, 0);
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->ReadListFile(listFile, currentStart);
  if (cmSystemTools::GetFatalErrorOccured()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  std::vector<cmMakefile*>::iterator sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}